

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O3

int __thiscall
aeron::archive::ControlResponsePoller::poll
          (ControlResponsePoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  element_type *peVar2;
  __pointer_type pIVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Image *this_00;
  Image *this_01;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  *(undefined4 *)&this->relevantId_ = 0xffffffff;
  *(undefined4 *)((long)&this->relevantId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->templateId_ = 0xffffffff;
  *(undefined4 *)((long)&this->templateId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->controlSessionId_ = 0xffffffff;
  *(undefined4 *)((long)&this->controlSessionId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->correlationId_ = 0xffffffff;
  *(undefined4 *)((long)&this->correlationId_ + 4) = 0xffffffff;
  this->isPollComplete_ = false;
  peVar2 = (this->subscription_).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_50._M_unused._M_object = &this->fragmentAssembler_;
  uVar7 = 0;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
             ::_M_manager;
  iVar1 = this->fragmentLimit_;
  pIVar3 = (peVar2->m_imageList)._M_b._M_p;
  this_00 = pIVar3->m_images;
  uVar8 = pIVar3->m_length;
  uVar5 = peVar2->m_roundRobinIndex;
  uVar9 = uVar5 + 1;
  if (uVar8 <= uVar5) {
    uVar5 = uVar7;
    uVar9 = uVar7;
  }
  peVar2->m_roundRobinIndex = uVar9;
  if ((0 < iVar1) && (uVar5 < uVar8)) {
    this_01 = this_00 + uVar5;
    uVar6 = 0;
    uVar9 = uVar5;
    do {
      uVar9 = uVar9 + 1;
      iVar4 = Image::
              controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                        (this_01,(function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                                  *)&local_50,iVar1 - uVar6);
      uVar6 = iVar4 + uVar6;
      uVar7 = (ulong)uVar6;
      if (uVar8 <= uVar9) break;
      this_01 = this_01 + 1;
    } while ((int)uVar6 < iVar1);
  }
  uVar6 = (uint)uVar7;
  if ((uVar5 != 0) && ((int)uVar6 < iVar1)) {
    uVar8 = 1;
    do {
      iVar4 = Image::
              controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                        (this_00,(function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                                  *)&local_50,iVar1 - (int)uVar7);
      uVar6 = (int)uVar7 + iVar4;
      uVar7 = (ulong)uVar6;
      if (uVar5 <= uVar8) break;
      uVar8 = uVar8 + 1;
      this_00 = this_00 + 1;
    } while ((int)uVar6 < iVar1);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return uVar6;
}

Assistant:

std::int32_t ControlResponsePoller::poll() {
    controlSessionId_ = -1;
    correlationId_ = -1;
    relevantId_ = -1;
    templateId_ = -1;
    isPollComplete_ = false;

    return subscription_->controlledPoll(fragmentAssembler_.handler(), fragmentLimit_);
}